

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImPlotRange *pIVar1;
  unsigned_long_long uVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterYs<unsigned_long_long> *pGVar8;
  TransformerLinLog *pTVar9;
  GetterYRef *pGVar10;
  ImPlotPlot *pIVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [12];
  ImPlotContext *pIVar18;
  ImPlotContext *pIVar19;
  int iVar20;
  ImDrawIdx IVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  pIVar18 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar20 = pGVar8->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar8->Ys +
           (long)(((prim + pGVar8->Offset) % iVar20 + iVar20) % iVar20) * (long)pGVar8->Stride);
  dVar3 = pGVar8->XScale;
  dVar4 = pGVar8->X0;
  dVar14 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  pIVar19 = GImPlot;
  iVar20 = pTVar9->YAxis;
  pIVar1 = &pIVar18->CurrentPlot->YAxis[iVar20].Range;
  dVar15 = pIVar1->Min;
  pGVar10 = this->Getter2;
  pTVar9 = this->Transformer;
  IVar5 = pIVar18->PixelRange[iVar20].Min;
  fVar24 = (float)(pIVar18->My[iVar20] *
                   ((dVar15 + (double)(float)(dVar14 / pIVar18->LogDenY[iVar20]) *
                              (pIVar1->Max - dVar15)) - dVar15) + (double)IVar5.y);
  fVar25 = (float)(pIVar18->Mx *
                   ((dVar4 + (double)prim * dVar3) - (pIVar18->CurrentPlot->XAxis).Range.Min) +
                  (double)IVar5.x);
  dVar3 = pGVar10->XScale;
  dVar4 = pGVar10->X0;
  dVar15 = log10(pGVar10->YRef / GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  iVar20 = pTVar9->YAxis;
  pIVar11 = pIVar19->CurrentPlot;
  dVar14 = pIVar11->YAxis[iVar20].Range.Min;
  IVar5 = pIVar19->PixelRange[iVar20].Min;
  fVar22 = (float)(pIVar19->Mx * ((dVar4 + (double)prim * dVar3) - (pIVar11->XAxis).Range.Min) +
                  (double)IVar5.x);
  fVar23 = (float)(pIVar19->My[iVar20] *
                   ((dVar14 + (double)(float)(dVar15 / pIVar19->LogDenY[iVar20]) *
                              (pIVar11->YAxis[iVar20].Range.Max - dVar14)) - dVar14) +
                  (double)IVar5.y);
  auVar29._0_4_ = ~-(uint)(fVar22 <= fVar25) & (uint)fVar22;
  auVar29._4_4_ = ~-(uint)(fVar23 <= fVar24) & (uint)fVar23;
  auVar29._8_4_ = ~-(uint)(fVar25 < fVar22) & (uint)fVar22;
  auVar29._12_4_ = ~-(uint)(fVar24 < fVar23) & (uint)fVar23;
  auVar16._4_4_ = (uint)fVar24 & -(uint)(fVar23 <= fVar24);
  auVar16._0_4_ = (uint)fVar25 & -(uint)(fVar22 <= fVar25);
  auVar16._8_4_ = (uint)fVar25 & -(uint)(fVar25 < fVar22);
  auVar16._12_4_ = (uint)fVar24 & -(uint)(fVar24 < fVar23);
  auVar29 = auVar29 | auVar16;
  fVar26 = (cull_rect->Min).y;
  auVar31._4_4_ = -(uint)(fVar26 < auVar29._4_4_);
  auVar31._0_4_ = -(uint)((cull_rect->Min).x < auVar29._0_4_);
  auVar17._4_8_ = auVar29._8_8_;
  auVar17._0_4_ = -(uint)(auVar29._4_4_ < fVar26);
  auVar30._0_8_ = auVar17._0_8_ << 0x20;
  auVar30._8_4_ = -(uint)(auVar29._8_4_ < (cull_rect->Max).x);
  auVar30._12_4_ = -(uint)(auVar29._12_4_ < (cull_rect->Max).y);
  auVar31._8_8_ = auVar30._8_8_;
  iVar20 = movmskps((int)pIVar11,auVar31);
  if (iVar20 == 0xf) {
    IVar6 = this->Col;
    IVar5 = *uv;
    fVar26 = fVar22 - fVar25;
    fVar27 = fVar23 - fVar24;
    fVar28 = fVar26 * fVar26 + fVar27 * fVar27;
    if (0.0 < fVar28) {
      fVar28 = 1.0 / SQRT(fVar28);
      fVar26 = fVar26 * fVar28;
      fVar27 = fVar27 * fVar28;
    }
    fVar28 = this->Weight * 0.5;
    pIVar12 = DrawList->_VtxWritePtr;
    fVar26 = fVar28 * fVar26;
    fVar28 = fVar28 * fVar27;
    (pIVar12->pos).x = fVar28 + fVar25;
    (pIVar12->pos).y = fVar24 - fVar26;
    (pIVar12->uv).x = IVar5.x;
    (pIVar12->uv).y = IVar5.y;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar6;
    pIVar12[1].pos.x = fVar28 + fVar22;
    pIVar12[1].pos.y = fVar23 - fVar26;
    pIVar12[1].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar6;
    pIVar12[2].pos.x = fVar22 - fVar28;
    pIVar12[2].pos.y = fVar23 + fVar26;
    pIVar12[2].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar6;
    pIVar12[3].pos.x = fVar25 - fVar28;
    pIVar12[3].pos.y = fVar26 + fVar24;
    pIVar12[3].uv = IVar5;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar21 = (ImDrawIdx)uVar7;
    *pIVar13 = IVar21;
    pIVar13[1] = IVar21 + 1;
    pIVar13[2] = IVar21 + 2;
    pIVar13[3] = IVar21;
    pIVar13[4] = IVar21 + 2;
    pIVar13[5] = IVar21 + 3;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  return (char)iVar20 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }